

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::StreamingConcatenationExpression::serializeTo
          (StreamingConcatenationExpression *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  reference pSVar2;
  Expression *__n;
  ASTSerializer *in_RSI;
  StreamingConcatenationExpression *in_RDI;
  StreamExpression *stream;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range3;
  ASTSerializer *in_stack_ffffffffffffff48;
  ASTSerializer *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  ASTSerializer *this_00;
  char *in_stack_ffffffffffffff70;
  void *local_88;
  int local_80;
  void *local_78;
  __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
  local_60;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_58;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *local_48;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_30;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,in_stack_ffffffffffffff58);
  ASTSerializer::write(in_RSI,local_20,local_18,in_RDI->sliceSize);
  local_30 = streams(in_RDI);
  bVar1 = std::
          span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
          ::empty((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                   *)0x85223f);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)local_10);
    name._M_str = in_stack_ffffffffffffff70;
    name._M_len = (size_t)in_RDI;
    ASTSerializer::startArray(in_RSI,name);
    local_58 = streams(in_RDI);
    local_48 = &local_58;
    local_60._M_current =
         (StreamExpression *)
         std::
         span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
         ::begin((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                  *)in_stack_ffffffffffffff48);
    std::
    span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
    ::end((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
           *)this_00);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff50,
                              (__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
               ::operator*(&local_60);
      ASTSerializer::startObject((ASTSerializer *)0x8522f1);
      in_stack_ffffffffffffff50 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)this_00);
      __n = not_null<const_slang::ast::Expression_*>::operator*
                      ((not_null<const_slang::ast::Expression_*> *)0x852319);
      ASTSerializer::write(in_stack_ffffffffffffff50,local_80,local_78,(size_t)__n);
      if (pSVar2->withExpr != (Expression *)0x0) {
        in_stack_ffffffffffffff48 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)this_00);
        ASTSerializer::write
                  (in_stack_ffffffffffffff48,(int)in_stack_ffffffffffffff70,local_88,
                   (size_t)pSVar2->withExpr);
      }
      ASTSerializer::endObject((ASTSerializer *)0x852382);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
      ::operator++(&local_60);
    }
    ASTSerializer::endArray((ASTSerializer *)0x85239e);
  }
  return;
}

Assistant:

void StreamingConcatenationExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("sliceSize", sliceSize);
    if (!streams().empty()) {
        serializer.startArray("streams");
        for (auto& stream : streams()) {
            serializer.startObject();
            serializer.write("operand", *stream.operand);
            if (stream.withExpr)
                serializer.write("withExpr", *stream.withExpr);
            serializer.endObject();
        }
        serializer.endArray();
    }
}